

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb__stb_idict_addset(stb_idict *a,stb_int32 k,stb_int32 v,int allow_new,int allow_old,int copy)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  uint local_38;
  uint s;
  int b;
  uint n;
  uint h;
  int copy_local;
  int allow_old_local;
  int allow_new_local;
  stb_int32 v_local;
  stb_int32 k_local;
  stb_idict *a_local;
  
  uVar3 = stb__stb_idict_hash(k);
  s = uVar3 & a->mask;
  local_38 = 0xffffffff;
  if (k != 1) {
    if (k != 3) {
      if (a->table[s].k != 1) {
        uVar2 = s;
        if ((a->table[s].k != 3) && (uVar2 = local_38, a->table[s].k == k)) {
          if (allow_old != 0) {
            a->table[s].v = v;
          }
          return (uint)((allow_new != 0 ^ 0xffU) & 1);
        }
        local_38 = uVar2;
        while (s = s + (uVar3 + (uVar3 >> 6) + (uVar3 >> 0x13) | 1) & a->mask, a->table[s].k != 1) {
          if (a->table[s].k == 3) {
            if ((int)local_38 < 0) {
              local_38 = s;
            }
          }
          else if (a->table[s].k == k) {
            if (allow_old != 0) {
              a->table[s].v = v;
            }
            return (uint)((allow_new != 0 ^ 0xffU) & 1);
          }
        }
      }
      if (allow_new == 0) {
        return 0;
      }
      if ((int)local_38 < 0) {
        local_38 = s;
      }
      else {
        a->deleted = a->deleted + -1;
      }
      a->table[(int)local_38].k = k;
      a->table[(int)local_38].v = v;
      a->count = a->count + 1;
      if (a->grow_threshhold < a->count) {
        stb__stb_idict_rehash(a,a->limit << 1);
      }
      return 1;
    }
    if (a->has_del == '\0') {
      if (allow_new != 0) goto LAB_001c53bd;
    }
    else if (allow_old != 0) {
LAB_001c53bd:
      uVar1 = a->has_del;
      a->dv = v;
      a->has_del = '\x01';
      return (uint)((uVar1 != '\0' ^ 0xffU) & 1);
    }
    return 0;
  }
  if (a->has_empty == '\0') {
    if (allow_new != 0) goto LAB_001c535d;
  }
  else if (allow_old != 0) {
LAB_001c535d:
    uVar1 = a->has_empty;
    a->ev = v;
    a->has_empty = '\x01';
    return (uint)((uVar1 != '\0' ^ 0xffU) & 1);
  }
  return 0;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}